

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_map.h
# Opt level: O3

ValueIterator __thiscall
CP::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>_>::insert_to_bucket
          (unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>_> *this,ValueT *val,
          size_t *bucketIdx)

{
  long lVar1;
  long lVar2;
  iterator iVar3;
  pointer pvVar4;
  size_t sVar5;
  float fVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  sVar5 = this->mSize;
  auVar7._8_4_ = (int)(sVar5 >> 0x20);
  auVar7._0_8_ = sVar5;
  auVar7._12_4_ = 0x45300000;
  pvVar4 = (this->mBuckets).
           super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar1 = (long)(this->mBuckets).
                super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar4 >> 3;
  lVar2 = lVar1 * -0x5555555555555555;
  auVar8._8_4_ = (int)((ulong)lVar2 >> 0x20);
  auVar8._0_8_ = lVar2;
  auVar8._12_4_ = 0x45300000;
  fVar6 = (float)(((auVar7._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)sVar5) - 4503599627370496.0)) /
                 ((auVar8._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)lVar2) - 4503599627370496.0)));
  if (this->mMaxLoadFactor <= fVar6 && fVar6 != this->mMaxLoadFactor) {
    rehash(this,lVar1 * 0x5555555555555556);
    pvVar4 = (this->mBuckets).
             super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    *bucketIdx = (ulong)(long)val->first %
                 (ulong)(((long)(this->mBuckets).
                                super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar4 >> 3) *
                        -0x5555555555555555);
    sVar5 = this->mSize;
  }
  this->mSize = sVar5 + 1;
  iVar3 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::insert
                    (pvVar4 + *bucketIdx,
                     pvVar4[*bucketIdx].
                     super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish,val);
  return (ValueIterator)iVar3._M_current;
}

Assistant:

ValueIterator insert_to_bucket(const ValueT& val, size_t& bucketIdx) {
      if (load_factor() > max_load_factor()) {
        rehash(2*bucket_count());
        bucketIdx = hash_to_bucket(val.first); // bucket size change after rehash
      }
      ++mSize;
      return mBuckets[bucketIdx].insert(mBuckets[bucketIdx].end(), val);
    }